

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

void psocks_conn_log_data(psocks_connection *conn,PsocksDirection dir,void *vdata,size_t len)

{
  FILE *fp;
  void *pvVar1;
  ptrlen str;
  char *local_60;
  char *thisdata;
  size_t thislen;
  char *nl;
  char *data;
  size_t len_local;
  void *vdata_local;
  PsocksDirection dir_local;
  psocks_connection *conn_local;
  
  data = (char *)len;
  if (((conn->ps->log_flags & 2) != 0) && (nl = (char *)vdata, conn->ps->logging_fp != (FILE *)0x0))
  {
    while (data != (char *)0x0) {
      pvVar1 = memchr(nl,10,(size_t)data);
      if (pvVar1 == (void *)0x0) {
        local_60 = data;
      }
      else {
        local_60 = (char *)((long)pvVar1 + (1 - (long)nl));
      }
      data = data + -(long)local_60;
      fprintf((FILE *)conn->ps->logging_fp,"c#%lu: %s \"",conn->index,
              psocks_conn_log_data::direction_names[dir]);
      fp = conn->ps->logging_fp;
      str = make_ptrlen(nl,(size_t)local_60);
      write_c_string_literal(fp,str);
      fprintf((FILE *)conn->ps->logging_fp,"\"\n");
      nl = local_60 + (long)nl;
    }
    fflush((FILE *)conn->ps->logging_fp);
  }
  if (conn->rec_sink != (PsocksDataSink *)0x0) {
    BinarySink_put_data(conn->rec_sink->s[dir]->binarysink_,vdata,(size_t)data);
  }
  return;
}

Assistant:

static void psocks_conn_log_data(psocks_connection *conn, PsocksDirection dir,
                                 const void *vdata, size_t len)
{
    if ((conn->ps->log_flags & LOG_DIALOGUE) && conn->ps->logging_fp) {
        const char *data = vdata;
        while (len > 0) {
            const char *nl = memchr(data, '\n', len);
            size_t thislen = nl ? (nl+1) - data : len;
            const char *thisdata = data;
            data += thislen;
            len -= thislen;

            static const char *const direction_names[2] = {
                [UP] = "send", [DN] = "recv" };

            fprintf(conn->ps->logging_fp, "c#%"PRIu64": %s \"", conn->index,
                    direction_names[dir]);
            write_c_string_literal(conn->ps->logging_fp,
                                   make_ptrlen(thisdata, thislen));
            fprintf(conn->ps->logging_fp, "\"\n");
        }

        fflush(conn->ps->logging_fp);
    }

    if (conn->rec_sink)
        put_data(conn->rec_sink->s[dir], vdata, len);
}